

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

RawBrandedSchema * __thiscall
capnp::SchemaLoader::Impl::makeDepSchema
          (Impl *this,Reader type,StringPtr scopeName,
          Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *brandBindings)

{
  Binding local_38;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_20;
  
  local_38.which = '\0';
  local_38.isImplicitParameter = false;
  local_38.listDepth = 0;
  local_38.paramIndex = 0;
  local_38._6_2_ = 0;
  local_38.field_4.schema = (RawBrandedSchema *)0x0;
  local_20.ptr.isSet = (brandBindings->ptr).isSet;
  if (local_20.ptr.isSet == true) {
    local_20.ptr.field_1.value.ptr = (brandBindings->ptr).field_1.value.ptr;
    local_20.ptr.field_1.value.size_ = (brandBindings->ptr).field_1.value.size_;
  }
  makeDep(this,&local_38,type,scopeName,&local_20);
  return local_38.field_4.schema;
}

Assistant:

const _::RawBrandedSchema* SchemaLoader::Impl::makeDepSchema(
    schema::Type::Reader type, kj::StringPtr scopeName,
    kj::Maybe<kj::ArrayPtr<const _::RawBrandedSchema::Scope>> brandBindings) {
  _::RawBrandedSchema::Binding binding;
  memset(&binding, 0, sizeof(binding));
  makeDep(binding, type, scopeName, brandBindings);
  return binding.schema;
}